

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namedenums.cpp
# Opt level: O2

void __thiscall OutputFile::OutputFile(OutputFile *this,string *filepath)

{
  string *this_00;
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  undefined8 extraout_RAX;
  char line [1024];
  
  (this->_buffer)._M_dataplus._M_p = (pointer)&(this->_buffer).field_2;
  (this->_buffer)._M_string_length = 0;
  (this->_buffer).field_2._M_local_buf[0] = '\0';
  this_00 = &this->_filepath;
  std::__cxx11::string::string((string *)this_00,(string *)filepath);
  __stream = fopen((this_00->_M_dataplus)._M_p,"r");
  if (__stream != (FILE *)0x0) {
    pcVar2 = fgets(line,0x400,__stream);
    if (pcVar2 == (char *)0x0) {
      Error("I/O error while reading %s",(this_00->_M_dataplus)._M_p);
      std::__cxx11::string::~string((string *)this_00);
      std::__cxx11::string::~string((string *)this);
      _Unwind_Resume(extraout_RAX);
    }
    iVar1 = bcmp(line,"// ",3);
    if (iVar1 == 0) {
      for (pcVar2 = line + 3; (*pcVar2 != '\0' && (*pcVar2 != '\n')); pcVar2 = pcVar2 + 1) {
      }
      *pcVar2 = '\0';
    }
    fclose(__stream);
  }
  return;
}

Assistant:

OutputFile (string const& filepath) :
		_filepath (filepath)
	{
		FILE* readhandle = fopen (_filepath.c_str(), "r");

		if (readhandle)
		{
			char line[1024];

			if (fgets (line, sizeof line, readhandle) == null)
				Error ("I/O error while reading %s", _filepath.c_str());

			if (strncmp (line, "// ", 3) == 0)
			{
				// Get rid of the newline at the end
				char* cp;
				for (cp = &line[3]; *cp != '\0' and *cp != '\n'; ++cp)
					;

				*cp = '\0';
			}

			fclose (readhandle);
		}
	}